

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_clump.c
# Opt level: O2

REF_STATUS ref_clump_tet_quality(REF_GRID_conflict ref_grid,REF_DBL min_quality,char *filename)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_DBL *pRVar1;
  REF_DICT pRVar2;
  uint uVar3;
  REF_STATUS RVar4;
  FILE *__s;
  long lVar5;
  undefined8 uVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  int cell;
  undefined8 uStackY_160;
  REF_INT local;
  REF_DICT local_138;
  REF_DICT local_130;
  REF_DICT ref_dict;
  REF_DBL quality;
  REF_INT nodes_1 [27];
  REF_INT nodes [27];
  
  ref_node = ref_grid->node;
  uVar3 = ref_dict_create(&ref_dict);
  if (uVar3 == 0) {
    ref_cell = ref_grid->cell[8];
    local_130 = (REF_DICT)filename;
    for (cell = 0; pRVar2 = local_130, cell < ref_cell->max; cell = cell + 1) {
      RVar4 = ref_cell_nodes(ref_cell,cell,nodes);
      if (RVar4 == 0) {
        uVar3 = ref_node_tet_quality(ref_node,nodes,&quality);
        if (uVar3 != 0) {
          uVar7 = (ulong)uVar3;
          pcVar8 = "qual";
          uVar6 = 0x22d;
          goto LAB_001dee65;
        }
        if ((quality < min_quality) && (uVar3 = ref_dict_store(ref_dict,cell,0), uVar3 != 0)) {
          uVar7 = (ulong)uVar3;
          pcVar8 = "store";
          uVar6 = 0x22e;
          goto LAB_001dee65;
        }
      }
    }
    __s = fopen((char *)local_130,"w");
    if (__s == (FILE *)0x0) {
      printf("unable to open %s\n",pRVar2);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0x233
             ,"ref_clump_tet_quality","unable to open file");
      return 2;
    }
    fwrite("title=\"tecplot refine cell clump file\"\n",0x27,1,__s);
    fwrite("variables = \"x\" \"y\" \"z\"\n",0x18,1,__s);
    pRVar2 = ref_dict;
    if (0 < ref_dict->n) {
      uVar3 = ref_dict_create(&local_138);
      if (uVar3 != 0) {
        uVar7 = (ulong)uVar3;
        pcVar8 = "create cell dict";
        uStackY_160 = 0x5a;
LAB_001df0a6:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
               uStackY_160,"ref_clump_cell_zone",uVar7,pcVar8);
        pcVar8 = "zone";
        uVar6 = 0x239;
        goto LAB_001dee65;
      }
      local_130 = pRVar2;
      for (lVar5 = 0; pRVar2 = local_130, lVar5 < local_130->n; lVar5 = lVar5 + 1) {
        uVar3 = ref_cell_nodes(ref_cell,local_130->key[lVar5],nodes_1);
        if (uVar3 != 0) {
          uVar7 = (ulong)uVar3;
          pcVar8 = "n";
          uStackY_160 = 0x5d;
          goto LAB_001df0a6;
        }
        lVar9 = 0;
        while (lVar9 < ref_cell->node_per) {
          uVar3 = ref_dict_store(local_138,nodes_1[lVar9],0);
          lVar9 = lVar9 + 1;
          if (uVar3 != 0) {
            uVar7 = (ulong)uVar3;
            pcVar8 = "store";
            uStackY_160 = 0x5f;
            goto LAB_001df0a6;
          }
        }
      }
      fprintf(__s,"zone t=\"%s\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
              "fetetrahedron",(ulong)(uint)local_138->n,(long)local_130->n,"point","fetetrahedron");
      for (lVar5 = 0; lVar5 < local_138->n; lVar5 = lVar5 + 1) {
        local = local_138->key[lVar5];
        lVar9 = (long)local;
        pRVar1 = ref_node->real;
        fprintf(__s," %.16e %.16e %.16e\n",pRVar1[lVar9 * 0xf],pRVar1[lVar9 * 0xf + 1],
                pRVar1[lVar9 * 0xf + 2]);
      }
      for (lVar5 = 0; lVar5 < pRVar2->n; lVar5 = lVar5 + 1) {
        uVar3 = ref_cell_nodes(ref_cell,pRVar2->key[lVar5],nodes_1);
        if (uVar3 != 0) {
          uVar7 = (ulong)uVar3;
          pcVar8 = "n";
          uStackY_160 = 0x6f;
          goto LAB_001df0a6;
        }
        for (lVar9 = 0; lVar9 < ref_cell->node_per; lVar9 = lVar9 + 1) {
          uVar3 = ref_dict_location(local_138,nodes_1[lVar9],&local);
          if (uVar3 != 0) {
            uVar7 = (ulong)uVar3;
            pcVar8 = "ret";
            uStackY_160 = 0x71;
            goto LAB_001df0a6;
          }
          fprintf(__s," %d",(ulong)(local + 1));
        }
        fputc(10,__s);
      }
    }
    fclose(__s);
    uVar3 = ref_dict_free(ref_dict);
    if (uVar3 == 0) {
      return 0;
    }
    uVar7 = (ulong)uVar3;
    pcVar8 = "free tet";
    uVar6 = 0x23d;
  }
  else {
    uVar7 = (ulong)uVar3;
    pcVar8 = "create cell dict";
    uVar6 = 0x229;
  }
LAB_001dee65:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",uVar6,
         "ref_clump_tet_quality",uVar7,pcVar8);
  return (REF_STATUS)uVar7;
}

Assistant:

REF_FCN REF_STATUS ref_clump_tet_quality(REF_GRID ref_grid, REF_DBL min_quality,
                                         const char *filename) {
  REF_DICT ref_dict;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL quality;
  const char *zonetype;
  FILE *f;

  RSS(ref_dict_create(&ref_dict), "create cell dict");

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_node_tet_quality(ref_node, nodes, &quality), "qual");
    if (quality < min_quality) RSS(ref_dict_store(ref_dict, cell, 0), "store");
  }

  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  fprintf(f, "title=\"tecplot refine cell clump file\"\n");
  fprintf(f, "variables = \"x\" \"y\" \"z\"\n");

  zonetype = "fetetrahedron";
  RSS(ref_clump_cell_zone(f, ref_cell, ref_dict, zonetype, ref_node), "zone");

  fclose(f);

  RSS(ref_dict_free(ref_dict), "free tet");

  return REF_SUCCESS;
}